

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::MemPoolT<104>::Clear(MemPoolT<104> *this)

{
  int iVar1;
  
  while( true ) {
    iVar1 = (this->_blockPtrs)._size;
    if ((long)iVar1 == 0) break;
    (this->_blockPtrs)._size = iVar1 + -1;
    operator_delete((this->_blockPtrs)._mem[(long)iVar1 + -1]);
  }
  this->_root = (Chunk *)0x0;
  this->_currentAllocs = 0;
  this->_nAllocs = 0;
  this->_maxAllocs = 0;
  this->_nUntracked = 0;
  return;
}

Assistant:

void Clear() {
        // Delete the blocks.
        while( !_blockPtrs.Empty()) {
            Block* b  = _blockPtrs.Pop();
            delete b;
        }
        _root = 0;
        _currentAllocs = 0;
        _nAllocs = 0;
        _maxAllocs = 0;
        _nUntracked = 0;
    }